

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

IGUISkin * __thiscall
irr::gui::CGUIEnvironment::createSkin(CGUIEnvironment *this,EGUI_SKIN_TYPE type)

{
  int iVar1;
  CGUISkin *this_00;
  undefined4 extraout_var;
  undefined8 uVar3;
  long *plVar4;
  long *plVar2;
  
  this_00 = (CGUISkin *)operator_new(0x280);
  CGUISkin::CGUISkin(this_00,type,this->Driver);
  iVar1 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0x13])(this);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 == (long *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    iVar1 = (**(code **)(*plVar2 + 0x18))(plVar2);
    plVar4 = (long *)0x0;
    if (iVar1 == 0) {
      plVar4 = plVar2;
    }
  }
  uVar3 = 0;
  (*(this_00->super_IGUISkin)._vptr_IGUISkin[7])(this_00,plVar2,0);
  if (plVar4 != (long *)0x0) {
    uVar3 = (**(code **)(*plVar4 + 0x58))(plVar4);
  }
  (*(this_00->super_IGUISkin)._vptr_IGUISkin[9])(this_00,uVar3);
  return &this_00->super_IGUISkin;
}

Assistant:

IGUISkin *CGUIEnvironment::createSkin(EGUI_SKIN_TYPE type)
{
	IGUISkin *skin = new CGUISkin(type, Driver);

	IGUIFont *builtinfont = getBuiltInFont();
	IGUIFontBitmap *bitfont = 0;
	if (builtinfont && builtinfont->getType() == EGFT_BITMAP)
		bitfont = (IGUIFontBitmap *)builtinfont;

	IGUISpriteBank *bank = 0;
	skin->setFont(builtinfont);

	if (bitfont)
		bank = bitfont->getSpriteBank();

	skin->setSpriteBank(bank);

	return skin;
}